

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,SyntaxKind directive)

{
  undefined6 in_register_00000012;
  
  (this->numFlags).raw = '\0';
  this->rawLen = 0;
  this->info = (Info *)0x0;
  if (((uint)CONCAT62(in_register_00000012,kind) & 0xfffffffd) == 0x158) {
    init(this,(EVP_PKEY_CTX *)alloc);
    *(SyntaxKind *)&this->info[1].rawTextPtr = directive;
    return;
  }
  assert::assertFailed
            ("kind == TokenKind::Directive || kind == TokenKind::MacroUsage",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Token.cpp"
             ,0xca,
             "slang::parsing::Token::Token(BumpAllocator &, TokenKind, span<const Trivia>, string_view, SourceLocation, SyntaxKind)"
            );
}

Assistant:

SVIntStorage& integer() { return *reinterpret_cast<SVIntStorage*>(extra()); }